

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O2

void testIDManifest(string *tempDir)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ChannelGroupManifest *pCVar10;
  ChannelGroupManifest *pCVar11;
  string *psVar12;
  ulong uVar13;
  long lVar14;
  ostream *poVar15;
  vector *pvVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  allocator<char> local_161;
  ulong local_160;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  chans2;
  IDManifest m2;
  IDManifest m8;
  IDManifest mfst;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comps;
  string fn;
  IDManifest m9;
  IDManifest m10;
  
  std::operator+(&fn,tempDir,"id_manifest.exr");
  Imf_3_2::IDManifest::IDManifest(&mfst);
  std::__cxx11::string::string<std::allocator<char>>((string *)&chans2,"id",(allocator<char> *)&m2);
  pCVar10 = (ChannelGroupManifest *)Imf_3_2::IDManifest::add((string *)&mfst);
  std::__cxx11::string::~string((string *)&chans2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&comps,2,(allocator_type *)&chans2);
  std::__cxx11::string::assign
            ((char *)comps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::assign
            ((char *)(comps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1));
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponents((vector *)pCVar10);
  std::__cxx11::string::_M_assign((string *)&pCVar10->_hashScheme);
  pCVar10->_lifeTime = LIFETIME_STABLE;
  pCVar11 = (ChannelGroupManifest *)Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar10,1)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"merino/body",(allocator<char> *)&m8);
  pCVar11 = (ChannelGroupManifest *)
            Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar11,(string *)&chans2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&m2,"wool",(allocator<char> *)&m9);
  Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar11,(string *)&m2);
  std::__cxx11::string::~string((string *)&m2);
  std::__cxx11::string::~string((string *)&chans2);
  pCVar11 = (ChannelGroupManifest *)Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar10,2)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"merino/body",(allocator<char> *)&m8);
  pCVar11 = (ChannelGroupManifest *)
            Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar11,(string *)&chans2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&m2,"skin",(allocator<char> *)&m9);
  Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar11,(string *)&m2);
  std::__cxx11::string::~string((string *)&m2);
  std::__cxx11::string::~string((string *)&chans2);
  pCVar11 = (ChannelGroupManifest *)Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar10,3)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"merino/body",(allocator<char> *)&m8);
  pCVar11 = (ChannelGroupManifest *)
            Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar11,(string *)&chans2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&m2,"skin",(allocator<char> *)&m9);
  Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar11,(string *)&m2);
  std::__cxx11::string::~string((string *)&m2);
  std::__cxx11::string::~string((string *)&chans2);
  pCVar10 = (ChannelGroupManifest *)Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar10,4)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"merino/eye",(allocator<char> *)&m8);
  pCVar10 = (ChannelGroupManifest *)
            Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar10,(string *)&chans2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&m2,"eye",(allocator<char> *)&m9);
  Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar10,(string *)&m2);
  std::__cxx11::string::~string((string *)&m2);
  std::__cxx11::string::~string((string *)&chans2);
  chans2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &chans2._M_t._M_impl.super__Rb_tree_header._M_header;
  chans2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  chans2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  chans2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  chans2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       chans2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m2,"instance1",(allocator<char> *)&m8);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&chans2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m2);
  std::__cxx11::string::~string((string *)&m2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m2,"instance2",(allocator<char> *)&m8);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&chans2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m2);
  std::__cxx11::string::~string((string *)&m2);
  psVar12 = (string *)Imf_3_2::IDManifest::add((set *)&mfst);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m2,"instance",(allocator<char> *)&m8);
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar12);
  std::__cxx11::string::~string((string *)&m2);
  std::__cxx11::string::_M_assign(psVar12 + 0x50);
  std::__cxx11::string::_M_assign(psVar12 + 0x70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m2,"1/2/3/4/5",(allocator<char> *)&m8);
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(psVar12);
  std::__cxx11::string::~string((string *)&m2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m2,"6/7/8/9/10",(allocator<char> *)&m8);
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(psVar12);
  std::__cxx11::string::~string((string *)&m2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m2,"11/12/13/14/15",(allocator<char> *)&m8);
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(psVar12);
  std::__cxx11::string::~string((string *)&m2);
  anon_unknown.dwarf_14c732::doReadWriteManifest(&mfst,&fn,true);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&chans2._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comps);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&mfst._manifest);
  std::__cxx11::string::~string((string *)&fn);
  Imf_3_2::IDManifest::IDManifest((IDManifest *)&fn);
  Imf_3_2::IDManifest::IDManifest(&m2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"id",(allocator<char> *)&mfst);
  Imf_3_2::IDManifest::add((string *)&fn);
  std::__cxx11::string::~string((string *)&chans2);
  psVar12 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&fn);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"name",(allocator<char> *)&mfst);
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar12);
  std::__cxx11::string::~string((string *)&chans2);
  uVar13 = Imf_3_2::IDManifest::operator[]((ulong)&fn);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"entryOne",(allocator<char> *)&mfst);
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar13,(string *)0x1);
  std::__cxx11::string::~string((string *)&chans2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"id2",(allocator<char> *)&mfst);
  Imf_3_2::IDManifest::add((string *)&m2);
  std::__cxx11::string::~string((string *)&chans2);
  psVar12 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&m2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"name",(allocator<char> *)&mfst);
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar12);
  std::__cxx11::string::~string((string *)&chans2);
  lVar14 = Imf_3_2::IDManifest::operator[]((ulong)&m2);
  std::__cxx11::string::_M_assign((string *)(lVar14 + 0x70));
  uVar13 = Imf_3_2::IDManifest::operator[]((ulong)&m2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"entryTwo",(allocator<char> *)&mfst);
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar13,(string *)0x2);
  std::__cxx11::string::~string((string *)&chans2);
  Imf_3_2::IDManifest::IDManifest((IDManifest *)&chans2);
  cVar1 = Imf_3_2::IDManifest::merge((IDManifest *)&chans2);
  if (cVar1 != '\0') {
    std::operator<<((ostream *)&std::cerr,"unexpected return value from merge command: m1 into m3");
  }
  cVar1 = Imf_3_2::IDManifest::merge((IDManifest *)&chans2);
  if (cVar1 != '\0') {
    std::operator<<((ostream *)&std::cerr,"unexpected return value from merge command: m2 into m3");
  }
  lVar14 = Imf_3_2::IDManifest::size();
  if (lVar14 != 2) {
    std::operator<<((ostream *)&std::cerr,
                    "expected manifest with two ChannelGroupManifests after merge operation");
  }
  pCVar10 = (ChannelGroupManifest *)Imf_3_2::IDManifest::operator[]((ulong)&chans2);
  pCVar11 = (ChannelGroupManifest *)Imf_3_2::IDManifest::operator[]((ulong)&fn);
  bVar2 = Imf_3_2::IDManifest::ChannelGroupManifest::operator!=(pCVar10,pCVar11);
  if (bVar2) {
    std::operator<<((ostream *)&std::cerr,"manifest merge of m1 failed\n");
  }
  pCVar10 = (ChannelGroupManifest *)Imf_3_2::IDManifest::operator[]((ulong)&chans2);
  pCVar11 = (ChannelGroupManifest *)Imf_3_2::IDManifest::operator[]((ulong)&m2);
  bVar2 = Imf_3_2::IDManifest::ChannelGroupManifest::operator!=(pCVar10,pCVar11);
  if (bVar2) {
    std::operator<<((ostream *)&std::cerr,"manifest merge of m1 failed\n");
  }
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)&chans2);
  Imf_3_2::IDManifest::IDManifest(&mfst);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"id",(allocator<char> *)&comps);
  Imf_3_2::IDManifest::add((string *)&mfst);
  std::__cxx11::string::~string((string *)&chans2);
  lVar14 = Imf_3_2::IDManifest::operator[]((ulong)&mfst);
  std::__cxx11::string::_M_assign((string *)(lVar14 + 0x70));
  lVar14 = Imf_3_2::IDManifest::operator[]((ulong)&mfst);
  *(undefined4 *)(lVar14 + 0x48) = 1;
  lVar14 = Imf_3_2::IDManifest::operator[]((ulong)&mfst);
  std::__cxx11::string::_M_assign((string *)(lVar14 + 0x50));
  psVar12 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&mfst);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"name",(allocator<char> *)&comps);
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar12);
  std::__cxx11::string::~string((string *)&chans2);
  uVar13 = Imf_3_2::IDManifest::operator[]((ulong)&mfst);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"entryTwo",(allocator<char> *)&comps);
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar13,(string *)0x2);
  std::__cxx11::string::~string((string *)&chans2);
  Imf_3_2::IDManifest::IDManifest((IDManifest *)&comps);
  std::__cxx11::string::string<std::allocator<char>>((string *)&chans2,"id",(allocator<char> *)&m8);
  Imf_3_2::IDManifest::add((string *)&comps);
  std::__cxx11::string::~string((string *)&chans2);
  psVar12 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&comps);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"name",(allocator<char> *)&m8);
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar12);
  std::__cxx11::string::~string((string *)&chans2);
  uVar13 = Imf_3_2::IDManifest::operator[]((ulong)&comps);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"entryOne",(allocator<char> *)&m8);
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar13,(string *)0x1);
  std::__cxx11::string::~string((string *)&chans2);
  uVar13 = Imf_3_2::IDManifest::operator[]((ulong)&comps);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"entryTwo",(allocator<char> *)&m8);
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar13,(string *)0x2);
  std::__cxx11::string::~string((string *)&chans2);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            *)&chans2,
           (vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            *)&fn);
  cVar1 = Imf_3_2::IDManifest::merge((IDManifest *)&chans2);
  if (cVar1 != '\0') {
    std::operator<<((ostream *)&std::cerr,"unexpected merge conflict of m3 into m5\n");
    poVar15 = std::operator<<((ostream *)&std::cerr,"m1:\n");
    anon_unknown.dwarf_14c732::operator<<(poVar15,(IDManifest *)&fn);
    poVar15 = std::operator<<(poVar15,"m3:\n");
    anon_unknown.dwarf_14c732::operator<<(poVar15,&mfst);
    poVar15 = std::operator<<(poVar15,"m5:\n");
    anon_unknown.dwarf_14c732::operator<<(poVar15,(IDManifest *)&chans2);
  }
  cVar1 = Imf_3_2::IDManifest::operator!=((IDManifest *)&chans2,(IDManifest *)&comps);
  if (cVar1 != '\0') {
    poVar15 = std::operator<<((ostream *)&std::cerr,"unexpected result from merge:\ngot ");
    anon_unknown.dwarf_14c732::operator<<(poVar15,(IDManifest *)&chans2);
    poVar15 = std::operator<<(poVar15,"\nexpected ");
    anon_unknown.dwarf_14c732::operator<<(poVar15,(IDManifest *)&comps);
    std::endl<char,std::char_traits<char>>(poVar15);
  }
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)&chans2);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)&comps);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&mfst._manifest);
  Imf_3_2::IDManifest::IDManifest(&mfst);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"id",(allocator<char> *)&comps);
  Imf_3_2::IDManifest::add((string *)&mfst);
  std::__cxx11::string::~string((string *)&chans2);
  psVar12 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&mfst);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"notname",(allocator<char> *)&comps);
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar12);
  std::__cxx11::string::~string((string *)&chans2);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            *)&comps,
           (vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            *)&fn);
  cVar1 = Imf_3_2::IDManifest::merge((IDManifest *)&comps);
  if (cVar1 == '\0') {
    std::operator<<((ostream *)&std::cerr,
                    "error: merge should have failed: different components in m6 and m7\n");
  }
  Imf_3_2::IDManifest::IDManifest(&m8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&chans2,"id",(allocator<char> *)&m9);
  Imf_3_2::IDManifest::add((string *)&m8);
  std::__cxx11::string::~string((string *)&chans2);
  psVar12 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&m8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"name",(allocator<char> *)&m9);
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar12);
  std::__cxx11::string::~string((string *)&chans2);
  uVar13 = Imf_3_2::IDManifest::operator[]((ulong)&m8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"a_different_value",(allocator<char> *)&m9);
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar13,(string *)0x1);
  std::__cxx11::string::~string((string *)&chans2);
  uVar13 = Imf_3_2::IDManifest::operator[]((ulong)&m8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&chans2,"a further value",(allocator<char> *)&m9);
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar13,(string *)0x3);
  std::__cxx11::string::~string((string *)&chans2);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::vector(&m9._manifest,
           (vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            *)&fn);
  cVar1 = Imf_3_2::IDManifest::merge(&m9);
  if (cVar1 == '\0') {
    std::operator<<((ostream *)&std::cerr,
                    "error: merge should have failed: conflicting values of ID 1 in m8 and m9\n");
  }
  Imf_3_2::IDManifest::IDManifest(&m10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&chans2,"id",&local_161);
  Imf_3_2::IDManifest::add((string *)&m10);
  std::__cxx11::string::~string((string *)&chans2);
  psVar12 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&m10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&chans2,"name",&local_161);
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar12);
  std::__cxx11::string::~string((string *)&chans2);
  uVar13 = Imf_3_2::IDManifest::operator[]((ulong)&m10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&chans2,"entryOne",&local_161);
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar13,(string *)0x1);
  std::__cxx11::string::~string((string *)&chans2);
  uVar13 = Imf_3_2::IDManifest::operator[]((ulong)&m10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&chans2,"a further value",&local_161)
  ;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar13,(string *)0x3);
  std::__cxx11::string::~string((string *)&chans2);
  cVar1 = Imf_3_2::IDManifest::operator!=(&m10,&m9);
  if (cVar1 != '\0') {
    poVar15 = std::operator<<((ostream *)&std::cerr,"unexpected result from merge:\ngot ");
    anon_unknown.dwarf_14c732::operator<<(poVar15,&m9);
    poVar15 = std::operator<<(poVar15," expected ");
    anon_unknown.dwarf_14c732::operator<<(poVar15,&m10);
    std::endl<char,std::char_traits<char>>(poVar15);
  }
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&m10._manifest);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&m9._manifest);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&m8._manifest);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)&comps);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&mfst._manifest);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&m2._manifest);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)&fn);
  std::operator+(&fn,tempDir,"id_manifest.exr");
  random_reseed(1);
  for (iVar9 = 0; iVar9 != 0x14; iVar9 = iVar9 + 1) {
    iVar3 = random_int(2);
    iVar4 = random_int(2);
    m8._manifest.
    super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    m8._manifest.
    super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    m8._manifest.
    super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (iVar4 != 0) {
      iVar4 = random_int(0xff);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&m8,(long)(iVar4 + 1));
      if (iVar4 < 0) {
        iVar4 = -1;
      }
      lVar19 = (long)iVar4 + 1;
      lVar14 = 0;
      while (bVar2 = lVar19 != 0, lVar19 = lVar19 + -1, bVar2) {
        m2._manifest.
        super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        m2._manifest.
        super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        m2._manifest.
        super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anon_unknown.dwarf_14c732::randomWord
                  ((string *)&chans2,iVar3 != 0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&m2);
        std::__cxx11::string::operator=
                  ((string *)
                   (&((m8._manifest.
                       super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_channels)._M_t._M_impl.field_0x0
                   + lVar14),(string *)&chans2);
        std::__cxx11::string::~string((string *)&chans2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&m2);
        lVar14 = lVar14 + 0x20;
      }
    }
    Imf_3_2::IDManifest::IDManifest(&m9);
    iVar4 = random_int(10);
    poVar15 = std::operator<<((ostream *)&std::cerr," testing manifest with ");
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar4);
    std::operator<<(poVar15," channel groups of size ");
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (iVar18 = 0; iVar18 != iVar4; iVar18 = iVar18 + 1) {
      iVar5 = random_int(9);
      local_160 = CONCAT44(local_160._4_4_,iVar5);
      chans2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      chans2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      chans2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &chans2._M_t._M_impl.super__Rb_tree_header._M_header;
      chans2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      chans2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           chans2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (iVar5 = 0; iVar5 <= (int)local_160; iVar5 = iVar5 + 1) {
        mfst._manifest.
        super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        mfst._manifest.
        super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        mfst._manifest.
        super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anon_unknown.dwarf_14c732::randomWord
                  ((string *)&m2,iVar3 != 0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&mfst);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&chans2,(string *)&m2);
        std::__cxx11::string::~string((string *)&m2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mfst);
      }
      pvVar16 = (vector *)Imf_3_2::IDManifest::add((set *)&m9);
      iVar5 = random_int(3);
      *(int *)(pvVar16 + 0x48) = iVar5;
      random_int(2);
      std::__cxx11::string::_M_assign((string *)(pvVar16 + 0x70));
      random_int(2);
      std::__cxx11::string::_M_assign((string *)(pvVar16 + 0x50));
      uVar6 = random_int(10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&m10,(long)(int)uVar6,(allocator_type *)&m2);
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      local_160 = (ulong)uVar6;
      lVar14 = local_160 << 5;
      for (lVar19 = 0; lVar14 != lVar19; lVar19 = lVar19 + 0x20) {
        anon_unknown.dwarf_14c732::randomWord
                  ((string *)&m2,iVar3 != 0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&m8);
        std::__cxx11::string::operator=
                  ((string *)
                   (&((m10._manifest.
                       super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_channels)._M_t._M_impl.field_0x0
                   + lVar19),(string *)&m2);
        std::__cxx11::string::~string((string *)&m2);
      }
      Imf_3_2::IDManifest::ChannelGroupManifest::setComponents(pvVar16);
      iVar5 = random_int(iVar9 * 0x4b0 + 0x4b0);
      uVar13 = local_160;
      poVar15 = (ostream *)std::ostream::operator<<(&std::cerr,iVar5);
      std::operator<<(poVar15,' ');
      std::ostream::flush();
      iVar17 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      for (; iVar17 != iVar5; iVar17 = iVar17 + 1) {
        for (uVar20 = 0; uVar20 != uVar13; uVar20 = uVar20 + 1) {
          m2._manifest.
          super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&m2._manifest.
                         super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          m2._manifest.
          super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          m2._manifest.
          super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)m2._manifest.
                                super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          iVar7 = random_int(10);
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          while (bVar2 = iVar7 != 0, iVar7 = iVar7 + -1, bVar2) {
            anon_unknown.dwarf_14c732::randomWord
                      ((string *)&comps,iVar3 != 0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&m8);
            iVar8 = random_int(2);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &mfst,(string *)&comps,"/_-=,\\,.;|\t"[iVar8]);
            std::__cxx11::string::append((string *)&m2);
            std::__cxx11::string::~string((string *)&mfst);
            std::__cxx11::string::~string((string *)&comps);
          }
          std::__cxx11::string::_M_assign
                    ((string *)
                     (&((m10._manifest.
                         super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_channels)._M_t._M_impl.
                       field_0x0 + uVar20 * 0x20));
          std::__cxx11::string::~string((string *)&m2);
          uVar13 = local_160;
        }
        Imf_3_2::IDManifest::ChannelGroupManifest::insert(pvVar16);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m10);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&chans2._M_t);
    }
    std::operator<<((ostream *)&std::cerr,"....");
    std::ostream::flush();
    anon_unknown.dwarf_14c732::doReadWriteManifest(&m9,&fn,false);
    std::operator<<((ostream *)&std::cerr,"ok\n");
    std::
    vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
    ::~vector(&m9._manifest);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&m8);
  }
  std::__cxx11::string::~string((string *)&fn);
  for (iVar9 = 0; iVar9 != 7; iVar9 = iVar9 + 1) {
    Imf_3_2::IDManifest::IDManifest(&mfst);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&chans2,"id",(allocator<char> *)&fn);
    pCVar10 = (ChannelGroupManifest *)Imf_3_2::IDManifest::add((string *)&mfst);
    std::__cxx11::string::~string((string *)&chans2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&comps,2,(allocator_type *)&chans2);
    std::__cxx11::string::assign
              ((char *)comps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::assign
              ((char *)(comps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1));
    Imf_3_2::IDManifest::ChannelGroupManifest::setComponents((vector *)pCVar10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&chans2,"stringBeforeInt\n",(allocator<char> *)&fn);
    Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar10,(string *)&chans2);
    std::__cxx11::string::~string((string *)&chans2);
    poVar15 = std::operator<<((ostream *)&std::cerr,
                              "ERROR: bad usage of IDManifest not detected in test ");
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar9);
    std::operator<<(poVar15,"\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&comps);
    std::
    vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
    ::~vector(&mfst._manifest);
  }
  return;
}

Assistant:

void
testIDManifest (const std::string& tempDir)
{
    //
    // simple test that the manifest 'round trips' correctly
    //
    testReadWriteManifest (tempDir);

    //
    // test manifest merge operations
    //
    testMerge ();

    // stress test - will randomly generate 'edge cases'
    testLargeManifest (tempDir);

    // test the API prevents creating invalid manifests
    testDoingBadThings ();
}